

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O1

bool __thiscall Refal2::CArbitraryInteger::SetValueByText(CArbitraryInteger *this,string *text)

{
  pointer puVar1;
  int iVar2;
  byte bVar3;
  TDigit digit;
  byte *pbVar4;
  TDigit digit_00;
  bool bVar5;
  CArbitraryInteger local_50;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  this->isNegative = false;
  if (text->_M_string_length == 0) {
    bVar5 = true;
  }
  else {
    pbVar4 = (byte *)(text->_M_dataplus)._M_p;
    bVar3 = *pbVar4;
    if ((bVar3 == 0x2d) || (bVar3 == 0x2b)) {
      this->isNegative = bVar3 == 0x2d;
      pbVar4 = pbVar4 + 1;
    }
    bVar5 = pbVar4 == (byte *)((text->_M_dataplus)._M_p + text->_M_string_length);
    if (bVar5) {
      digit_00 = 0;
      iVar2 = 0;
LAB_00118d2c:
      if (iVar2 < 1) {
        digit = 1;
      }
      else {
        iVar2 = iVar2 + 1;
        digit = 1;
        do {
          digit = digit * 10;
          iVar2 = iVar2 + -1;
        } while (1 < iVar2);
      }
      CArbitraryInteger(&local_50,digit);
      mul(this,&local_50);
      if (local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      CArbitraryInteger(&local_50,digit_00);
      add(this,&local_50);
      if (local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar3 = *pbVar4;
      if ((byte)(bVar3 - 0x30) < 10) {
        digit_00 = 0;
        iVar2 = 0;
        do {
          pbVar4 = pbVar4 + 1;
          digit_00 = ((uint)bVar3 + digit_00 * 10) - 0x30;
          iVar2 = iVar2 + 1;
          if (iVar2 == 7) {
            CArbitraryInteger(&local_50,10000000);
            mul(this,&local_50);
            if (local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            CArbitraryInteger(&local_50,digit_00);
            add(this,&local_50);
            if (local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_50.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            digit_00 = 0;
            iVar2 = 0;
          }
          bVar5 = pbVar4 == (byte *)((text->_M_dataplus)._M_p + text->_M_string_length);
          if (bVar5) goto LAB_00118d2c;
          bVar3 = *pbVar4;
        } while ((byte)(bVar3 - 0x30) < 10);
      }
      puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar1) {
        (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar1;
      }
      this->isNegative = false;
    }
  }
  return bVar5;
}

Assistant:

bool CArbitraryInteger::SetValueByText( const std::string& text )
{
	Zero();
	if( text.empty() ) {
		return true;
	}
	std::string::const_iterator c = text.cbegin();
	if( *c == '-' || *c == '+' ) {
		SetSign( *c == '-' );
		++c;
	}
	TDigit digit = 0;
	const int maxDecimalDigits = 7;
	const TDigit maxDecimal = 10000000;
	static_assert( Base > maxDecimal, "too small Base" );
	int decimalCount = 0;
	for( ; c != text.cend(); ++c ) {
		if( *c >= '0' && *c <= '9' ) {
			digit = digit * 10 + ( *c - '0' );
			decimalCount++;
			if( decimalCount == maxDecimalDigits ) {
				mul( CArbitraryInteger( maxDecimal ) );
				add( CArbitraryInteger( digit ) );
				digit = 0;
				decimalCount = 0;
			}
		} else {
			Zero();
			return false;
		}
	}
	TDigit decimal = 1;
	for( ; decimalCount > 0; decimalCount-- ) {
		decimal *= 10;
	}
	mul( CArbitraryInteger( decimal ) );
	add( CArbitraryInteger( digit ) );
	return true;
}